

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch.cpp
# Opt level: O0

Error asmjit::ArchUtils::typeIdToRegInfo(uint32_t archType,uint32_t *typeIdInOut,RegInfo *regInfo)

{
  byte bVar1;
  undefined4 *in_RDX;
  uint *in_RSI;
  uint in_EDI;
  uint32_t regType;
  uint32_t size;
  uint32_t typeId;
  char *in_stack_00000390;
  int in_stack_0000039c;
  char *in_stack_000003a0;
  bool local_57;
  uint local_54;
  uint local_4c;
  Error local_30;
  
  local_4c = *in_RSI;
  *in_RDX = 0;
  if (in_EDI == 0 || 3 < in_EDI) {
    local_30 = 5;
  }
  else {
    if (local_4c < 0x20) {
      local_4c = (uint)(byte)x86OpData[(ulong)local_4c + 0xa0];
    }
    if (local_4c < 0x20 || 100 < local_4c) {
      local_30 = 0x30;
    }
    else {
      local_57 = 0x1f < local_4c && local_4c < 0x22;
      if (local_57) {
        if (local_4c == 0x20) {
          local_4c = 0x28;
          if (in_EDI == 1) {
            local_4c = 0x26;
          }
        }
        else {
          local_4c = 0x29;
          if (in_EDI == 1) {
            local_4c = 0x27;
          }
        }
      }
      if (0x7f < local_4c) {
        DebugUtils::assertionFailed(in_stack_000003a0,in_stack_0000039c,in_stack_00000390);
      }
      bVar1 = TypeId::_info[local_4c];
      if (bVar1 == 0) {
        local_30 = 0x30;
      }
      else if (local_4c == 0x2c) {
        local_30 = 0x33;
      }
      else {
        switch(local_4c) {
        case 0x22:
        case 0x23:
          local_54 = 2;
          break;
        case 0x24:
        case 0x25:
          local_54 = 4;
          break;
        case 0x26:
        case 0x27:
          local_54 = 5;
          break;
        case 0x28:
        case 0x29:
          if (in_EDI == 1) {
            return 0x32;
          }
          local_54 = 6;
          break;
        case 0x2a:
          local_4c = 0x3b;
          local_54 = 9;
          break;
        case 0x2b:
          local_4c = 0x46;
          local_54 = 9;
          break;
        default:
          if (bVar1 < 0x11) {
            local_54 = 9;
          }
          else if (bVar1 == 0x20) {
            local_54 = 10;
          }
          else {
            local_54 = 0xb;
          }
          break;
        case 0x2d:
        case 0x2e:
        case 0x2f:
        case 0x30:
          local_54 = 0x12;
          break;
        case 0x31:
        case 0x32:
          local_54 = 0x11;
        }
        *in_RSI = local_4c;
        *in_RDX = *(undefined4 *)(x86OpData + (ulong)local_54 * 4);
        local_30 = 0;
      }
    }
  }
  return local_30;
}

Assistant:

ASMJIT_FAVOR_SIZE Error ArchUtils::typeIdToRegInfo(uint32_t archType, uint32_t& typeIdInOut, RegInfo& regInfo) noexcept {
  uint32_t typeId = typeIdInOut;

  // Zero the signature so it's clear in case that typeId is not invalid.
  regInfo._signature = 0;

#if defined(ASMJIT_BUILD_X86)
  if (ArchInfo::isX86Family(archType)) {
    // Passed RegType instead of TypeId?
    if (typeId <= Reg::kRegMax)
      typeId = x86OpData.archRegs.regTypeToTypeId[typeId];

    if (ASMJIT_UNLIKELY(!TypeId::isValid(typeId)))
      return DebugUtils::errored(kErrorInvalidTypeId);

    // First normalize architecture dependent types.
    if (TypeId::isAbstract(typeId)) {
      if (typeId == TypeId::kIntPtr)
        typeId = (archType == ArchInfo::kTypeX86) ? TypeId::kI32 : TypeId::kI64;
      else
        typeId = (archType == ArchInfo::kTypeX86) ? TypeId::kU32 : TypeId::kU64;
    }

    // Type size helps to construct all kinds of registers. If the size is zero
    // then the TypeId is invalid.
    uint32_t size = TypeId::sizeOf(typeId);
    if (ASMJIT_UNLIKELY(!size))
      return DebugUtils::errored(kErrorInvalidTypeId);

    if (ASMJIT_UNLIKELY(typeId == TypeId::kF80))
      return DebugUtils::errored(kErrorInvalidUseOfF80);

    uint32_t regType = 0;

    switch (typeId) {
      case TypeId::kI8:
      case TypeId::kU8:
        regType = X86Reg::kRegGpbLo;
        break;

      case TypeId::kI16:
      case TypeId::kU16:
        regType = X86Reg::kRegGpw;
        break;

      case TypeId::kI32:
      case TypeId::kU32:
        regType = X86Reg::kRegGpd;
        break;

      case TypeId::kI64:
      case TypeId::kU64:
        if (archType == ArchInfo::kTypeX86)
          return DebugUtils::errored(kErrorInvalidUseOfGpq);

        regType = X86Reg::kRegGpq;
        break;

      // F32 and F64 are always promoted to use vector registers.
      case TypeId::kF32:
        typeId = TypeId::kF32x1;
        regType = X86Reg::kRegXmm;
        break;

      case TypeId::kF64:
        typeId = TypeId::kF64x1;
        regType = X86Reg::kRegXmm;
        break;

      // Mask registers {k}.
      case TypeId::kMask8:
      case TypeId::kMask16:
      case TypeId::kMask32:
      case TypeId::kMask64:
        regType = X86Reg::kRegK;
        break;

      // MMX registers.
      case TypeId::kMmx32:
      case TypeId::kMmx64:
        regType = X86Reg::kRegMm;
        break;

      // XMM|YMM|ZMM registers.
      default:
        if (size <= 16)
          regType = X86Reg::kRegXmm;
        else if (size == 32)
          regType = X86Reg::kRegYmm;
        else
          regType = X86Reg::kRegZmm;
        break;
    }

    typeIdInOut = typeId;
    regInfo._signature = x86OpData.archRegs.regInfo[regType].getSignature();
    return kErrorOk;
  }
#endif // ASMJIT_BUILD_X86

  return DebugUtils::errored(kErrorInvalidArch);
}